

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

CharClassBuilder * __thiscall re2::CharClassBuilder::Copy(CharClassBuilder *this)

{
  CharClassBuilder *pCVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  RuneRange local_38;
  
  pCVar1 = (CharClassBuilder *)operator_new(0x40);
  p_Var2 = &(pCVar1->ranges_)._M_t._M_impl.super__Rb_tree_header;
  (pCVar1->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pCVar1->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pCVar1->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pCVar1->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pCVar1->ranges_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar1->nrunes_ = 0;
  pCVar1->upper_ = 0;
  pCVar1->lower_ = 0;
  p_Var3 = (this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->ranges_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var2) {
    do {
      local_38.lo = p_Var3[1]._M_color;
      local_38.hi = *(Rune *)&p_Var3[1].field_0x4;
      std::
      _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
      ::_M_insert_unique<re2::RuneRange>(&(pCVar1->ranges_)._M_t,&local_38);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var2);
  }
  pCVar1->upper_ = this->upper_;
  pCVar1->lower_ = this->lower_;
  pCVar1->nrunes_ = this->nrunes_;
  return pCVar1;
}

Assistant:

CharClassBuilder* CharClassBuilder::Copy() {
  CharClassBuilder* cc = new CharClassBuilder;
  for (iterator it = begin(); it != end(); ++it)
    cc->ranges_.insert(RuneRange(it->lo, it->hi));
  cc->upper_ = upper_;
  cc->lower_ = lower_;
  cc->nrunes_ = nrunes_;
  return cc;
}